

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool bssl::setup_ech_grease(SSL_HANDSHAKE *hs)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  uint8_t value;
  bool bVar1;
  uint16_t value_00;
  int iVar2;
  pointer pSVar3;
  size_t sVar4;
  size_t sVar5;
  cbb_st *pcVar6;
  EVP_HPKE_AEAD *local_138;
  uint local_12c;
  uchar *local_118;
  uint8_t *payload;
  CBB payload_cbb;
  CBB enc_cbb;
  ScopedCBB cbb;
  size_t payload_len;
  uint8_t private_key_unused [32];
  uint8_t enc [32];
  uint8_t config_id;
  EVP_HPKE_AEAD *aead;
  bool has_aes_hw;
  uint16_t kdf_id;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->selected_ech_config);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!hs->selected_ech_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x2d3,"bool bssl::setup_ech_grease(SSL_HANDSHAKE *)");
  }
  if ((hs->max_version < 0x304) || ((*(ushort *)&hs->config->field_0x10d & 1) == 0)) {
    return true;
  }
  pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&hs->ssl->config);
  if ((*(ushort *)&pSVar3->field_0x10d >> 0xb & 1) == 0) {
    local_12c = EVP_has_aes_hardware();
  }
  else {
    pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                       (&hs->ssl->config);
    local_12c = (uint)((byte)((ushort)*(undefined2 *)&pSVar3->field_0x10d >> 0xc) & 1);
  }
  if (local_12c == 0) {
    local_138 = EVP_hpke_chacha20_poly1305();
  }
  else {
    local_138 = EVP_hpke_aes_128_gcm();
  }
  value = hs->grease_seed[6];
  X25519_keypair(private_key_unused + 0x18,(uint8_t *)&payload_len);
  sVar4 = random_size(4,7);
  sVar5 = aead_overhead(local_138);
  sVar5 = sVar4 * 0x20 + sVar5;
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&enc_cbb.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  iVar2 = CBB_init(pcVar6,0x100);
  if (iVar2 != 0) {
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&enc_cbb.u + 0x18));
    iVar2 = CBB_add_u16(pcVar6,1);
    if (iVar2 != 0) {
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&enc_cbb.u + 0x18));
      value_00 = EVP_HPKE_AEAD_id(local_138);
      iVar2 = CBB_add_u16(pcVar6,value_00);
      if (iVar2 != 0) {
        pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&enc_cbb.u + 0x18));
        iVar2 = CBB_add_u8(pcVar6,value);
        if (iVar2 != 0) {
          pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&enc_cbb.u + 0x18));
          iVar2 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)((long)&payload_cbb.u + 0x18));
          if ((iVar2 != 0) &&
             (iVar2 = CBB_add_bytes((CBB *)((long)&payload_cbb.u + 0x18),private_key_unused + 0x18,
                                    0x20), iVar2 != 0)) {
            pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&enc_cbb.u + 0x18));
            iVar2 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)&payload);
            if ((iVar2 != 0) &&
               ((iVar2 = CBB_add_space((CBB *)&payload,&local_118,sVar5), iVar2 != 0 &&
                (iVar2 = RAND_bytes(local_118,(int)sVar5), iVar2 != 0)))) {
              pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&enc_cbb.u + 0x18));
              bVar1 = CBBFinishArray(pcVar6,&hs->ech_client_outer);
              if (bVar1) {
                hs_local._7_1_ = true;
                goto LAB_0015b677;
              }
            }
          }
        }
      }
    }
  }
  hs_local._7_1_ = false;
LAB_0015b677:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&enc_cbb.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

static bool setup_ech_grease(SSL_HANDSHAKE *hs) {
  assert(!hs->selected_ech_config);
  if (hs->max_version < TLS1_3_VERSION || !hs->config->ech_grease_enabled) {
    return true;
  }

  const uint16_t kdf_id = EVP_HPKE_HKDF_SHA256;
  const bool has_aes_hw = hs->ssl->config->aes_hw_override
                              ? hs->ssl->config->aes_hw_override_value
                              : EVP_has_aes_hardware();
  const EVP_HPKE_AEAD *aead =
      has_aes_hw ? EVP_hpke_aes_128_gcm() : EVP_hpke_chacha20_poly1305();
  static_assert(ssl_grease_ech_config_id < sizeof(hs->grease_seed),
                "hs->grease_seed is too small");
  uint8_t config_id = hs->grease_seed[ssl_grease_ech_config_id];

  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  uint8_t private_key_unused[X25519_PRIVATE_KEY_LEN];
  X25519_keypair(enc, private_key_unused);

  // To determine a plausible length for the payload, we estimate the size of a
  // typical EncodedClientHelloInner without resumption:
  //
  //   2+32+1+2   version, random, legacy_session_id, legacy_compression_methods
  //   2+4*2      cipher_suites (three TLS 1.3 ciphers, GREASE)
  //   2          extensions prefix
  //   5          inner encrypted_client_hello
  //   4+1+2*2    supported_versions (TLS 1.3, GREASE)
  //   4+1+10*2   outer_extensions (key_share, sigalgs, sct, alpn,
  //              supported_groups, status_request, psk_key_exchange_modes,
  //              compress_certificate, GREASE x2)
  //
  // The server_name extension has an overhead of 9 bytes. For now, arbitrarily
  // estimate maximum_name_length to be between 32 and 100 bytes. Then round up
  // to a multiple of 32, to match draft-ietf-tls-esni-13, section 6.1.3.
  const size_t payload_len =
      32 * random_size(128 / 32, 224 / 32) + aead_overhead(aead);
  bssl::ScopedCBB cbb;
  CBB enc_cbb, payload_cbb;
  uint8_t *payload;
  if (!CBB_init(cbb.get(), 256) || !CBB_add_u16(cbb.get(), kdf_id) ||
      !CBB_add_u16(cbb.get(), EVP_HPKE_AEAD_id(aead)) ||
      !CBB_add_u8(cbb.get(), config_id) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &enc_cbb) ||
      !CBB_add_bytes(&enc_cbb, enc, sizeof(enc)) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &payload_cbb) ||
      !CBB_add_space(&payload_cbb, &payload, payload_len) ||
      !RAND_bytes(payload, payload_len) ||
      !CBBFinishArray(cbb.get(), &hs->ech_client_outer)) {
    return false;
  }
  return true;
}